

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O0

void __thiscall
t_cpp_generator::generate_struct_definition
          (t_cpp_generator *this,ostream *out,ostream *force_cpp_out,t_struct *tstruct,bool setters,
          bool is_user_struct)

{
  bool bVar1;
  int iVar2;
  e_req eVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  reference pptVar4;
  undefined4 extraout_var_01;
  ostream *poVar5;
  undefined4 extraout_var_02;
  string *psVar6;
  t_type *ptVar7;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  undefined1 local_179;
  undefined1 local_178 [7];
  bool is_optional;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_d8;
  t_field **local_d0;
  string local_c8;
  string local_a8;
  _Self local_88 [3];
  allocator local_69;
  key_type local_68;
  _Self local_48;
  members_type *local_40;
  vector<t_field_*,_std::allocator<t_field_*>_> *members;
  const_iterator m_iter;
  bool is_user_struct_local;
  bool setters_local;
  t_struct *tstruct_local;
  ostream *force_cpp_out_local;
  ostream *out_local;
  t_cpp_generator *this_local;
  
  m_iter._M_current._6_1_ = is_user_struct;
  m_iter._M_current._7_1_ = setters;
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                     *)&members);
  local_40 = t_struct::get_members(tstruct);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"final",&local_69);
  local_48._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&(tstruct->super_t_type).annotations_,&local_68);
  local_88[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&(tstruct->super_t_type).annotations_);
  bVar1 = std::operator==(&local_48,local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  if (bVar1) {
    poVar5 = std::operator<<(force_cpp_out,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_a8,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_a8);
    iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar5 = std::operator<<(poVar5,(string *)CONCAT44(extraout_var,iVar2));
    poVar5 = std::operator<<(poVar5,"::~");
    iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar5 = std::operator<<(poVar5,(string *)CONCAT44(extraout_var_00,iVar2));
    poVar5 = std::operator<<(poVar5,"() noexcept {");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_a8);
    t_generator::indent_up((t_generator *)this);
    t_generator::indent_down((t_generator *)this);
    t_generator::indent_abi_cxx11_(&local_c8,(t_generator *)this);
    poVar5 = std::operator<<(force_cpp_out,(string *)&local_c8);
    poVar5 = std::operator<<(poVar5,"}");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  if ((m_iter._M_current._7_1_ & 1) != 0) {
    local_d0 = (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(local_40);
    members = (vector<t_field_*,_std::allocator<t_field_*>_> *)local_d0;
    while( true ) {
      local_d8._M_current =
           (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(local_40);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                          *)&members,&local_d8);
      if (!bVar1) break;
      pptVar4 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                             *)&members);
      bVar1 = is_reference(this,*pptVar4);
      if (bVar1) {
        poVar5 = std::operator<<(out,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_f8,(t_generator *)this);
        poVar5 = std::operator<<(poVar5,(string *)&local_f8);
        poVar5 = std::operator<<(poVar5,"void ");
        iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
        poVar5 = std::operator<<(poVar5,(string *)CONCAT44(extraout_var_01,iVar2));
        poVar5 = std::operator<<(poVar5,"::__set_");
        pptVar4 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                               *)&members);
        psVar6 = t_field::get_name_abi_cxx11_(*pptVar4);
        poVar5 = std::operator<<(poVar5,(string *)psVar6);
        poVar5 = std::operator<<(poVar5,"(::std::shared_ptr<");
        pptVar4 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                               *)&members);
        ptVar7 = t_field::get_type(*pptVar4);
        type_name_abi_cxx11_(&local_118,this,ptVar7,false,false);
        poVar5 = std::operator<<(poVar5,(string *)&local_118);
        std::operator<<(poVar5,">");
        std::__cxx11::string::~string((string *)&local_118);
        std::__cxx11::string::~string((string *)&local_f8);
        poVar5 = std::operator<<(out," val) {");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      }
      else {
        poVar5 = std::operator<<(out,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_138,(t_generator *)this);
        poVar5 = std::operator<<(poVar5,(string *)&local_138);
        poVar5 = std::operator<<(poVar5,"void ");
        iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
        poVar5 = std::operator<<(poVar5,(string *)CONCAT44(extraout_var_02,iVar2));
        poVar5 = std::operator<<(poVar5,"::__set_");
        pptVar4 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                               *)&members);
        psVar6 = t_field::get_name_abi_cxx11_(*pptVar4);
        poVar5 = std::operator<<(poVar5,(string *)psVar6);
        poVar5 = std::operator<<(poVar5,"(");
        pptVar4 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                               *)&members);
        ptVar7 = t_field::get_type(*pptVar4);
        type_name_abi_cxx11_(&local_158,this,ptVar7,false,true);
        std::operator<<(poVar5,(string *)&local_158);
        std::__cxx11::string::~string((string *)&local_158);
        std::__cxx11::string::~string((string *)&local_138);
        poVar5 = std::operator<<(out," val) {");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      }
      t_generator::indent_up((t_generator *)this);
      t_generator::indent_abi_cxx11_((string *)local_178,(t_generator *)this);
      poVar5 = std::operator<<(out,(string *)local_178);
      poVar5 = std::operator<<(poVar5,"this->");
      pptVar4 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                             *)&members);
      psVar6 = t_field::get_name_abi_cxx11_(*pptVar4);
      poVar5 = std::operator<<(poVar5,(string *)psVar6);
      poVar5 = std::operator<<(poVar5," = val;");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)local_178);
      t_generator::indent_down((t_generator *)this);
      pptVar4 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                             *)&members);
      eVar3 = t_field::get_req(*pptVar4);
      local_179 = eVar3 == T_OPTIONAL;
      if ((bool)local_179) {
        t_generator::indent_abi_cxx11_(&local_1a0,(t_generator *)this);
        poVar5 = std::operator<<(out,(string *)&local_1a0);
        t_generator::indent_abi_cxx11_(&local_1c0,(t_generator *)this);
        poVar5 = std::operator<<(poVar5,(string *)&local_1c0);
        poVar5 = std::operator<<(poVar5,"__isset.");
        pptVar4 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                               *)&members);
        psVar6 = t_field::get_name_abi_cxx11_(*pptVar4);
        poVar5 = std::operator<<(poVar5,(string *)psVar6);
        poVar5 = std::operator<<(poVar5," = true;");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_1c0);
        std::__cxx11::string::~string((string *)&local_1a0);
      }
      t_generator::indent_abi_cxx11_(&local_1e0,(t_generator *)this);
      poVar5 = std::operator<<(out,(string *)&local_1e0);
      poVar5 = std::operator<<(poVar5,"}");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_1e0);
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  *)&members);
    }
  }
  if ((m_iter._M_current._6_1_ & 1) != 0) {
    generate_struct_ostream_operator(this,out,tstruct);
  }
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_cpp_generator::generate_struct_definition(ostream& out,
                                                 ostream& force_cpp_out,
                                                 t_struct* tstruct,
                                                 bool setters,
                                                 bool is_user_struct) {
  // Get members
  vector<t_field*>::const_iterator m_iter;
  const vector<t_field*>& members = tstruct->get_members();

  // Destructor
  if (tstruct->annotations_.find("final") == tstruct->annotations_.end()) {
    force_cpp_out << endl << indent() << tstruct->get_name() << "::~" << tstruct->get_name()
                  << "() noexcept {" << endl;
    indent_up();

    indent_down();
    force_cpp_out << indent() << "}" << endl << endl;
  }

  // Create a setter function for each field
  if (setters) {
    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
      if (is_reference((*m_iter))) {
        out << endl << indent() << "void " << tstruct->get_name() << "::__set_"
            << (*m_iter)->get_name() << "(::std::shared_ptr<"
            << type_name((*m_iter)->get_type(), false, false) << ">";
        out << " val) {" << endl;
      } else {
        out << endl << indent() << "void " << tstruct->get_name() << "::__set_"
            << (*m_iter)->get_name() << "(" << type_name((*m_iter)->get_type(), false, true);
        out << " val) {" << endl;
      }
      indent_up();
      out << indent() << "this->" << (*m_iter)->get_name() << " = val;" << endl;
      indent_down();

      // assume all fields are required except optional fields.
      // for optional fields change __isset.name to true
      bool is_optional = (*m_iter)->get_req() == t_field::T_OPTIONAL;
      if (is_optional) {
        out << indent() << indent() << "__isset." << (*m_iter)->get_name() << " = true;" << endl;
      }
      out << indent() << "}" << endl;
    }
  }
  if (is_user_struct) {
    generate_struct_ostream_operator(out, tstruct);
  }
  out << endl;
}